

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow.c
# Opt level: O2

_Bool borg_can_dig(_Bool check_fail,uint8_t feat)

{
  int iVar1;
  _Bool _Var2;
  int iVar3;
  
  if ((borg.trait[0x6d] == 0) && (0xe < feat && (feat & 0xfe) != 0x16)) {
    iVar1 = 0xd;
    if (feat == '\x15') {
      iVar1 = 0x28;
    }
    iVar3 = iVar1 + -0x14;
    if (borg.times_twitch < 0x16) {
      iVar3 = iVar1;
    }
    if ((((long)weapon_swap != 0) && (iVar3 <= borg.trait[0x3f])) &&
       (borg_items[(long)weapon_swap + -1].tval == '\x06')) {
      return true;
    }
    if (iVar3 + 0x14 <= borg.trait[0x3f]) {
      return true;
    }
    if ((feat == '\x10') && (borg.trait[0x6c] == 0)) {
      return true;
    }
    if (check_fail) {
      _Var2 = borg_spell_okay_fail(TURN_STONE_TO_MUD,L'(');
      if (_Var2) {
        return true;
      }
      _Var2 = borg_spell_okay_fail(SHATTER_STONE,L'(');
      if (_Var2) {
        return true;
      }
      _Var2 = true;
    }
    else {
      _Var2 = borg_spell_okay(TURN_STONE_TO_MUD);
      if (_Var2) {
        return true;
      }
      _Var2 = borg_spell_okay(SHATTER_STONE);
      if (_Var2) {
        return true;
      }
      _Var2 = false;
    }
    _Var2 = borg_equips_item(act_stone_to_mud,_Var2);
    if (_Var2) {
      return true;
    }
    _Var2 = borg_equips_ring(sv_ring_digging);
    if (_Var2) {
      return true;
    }
  }
  return false;
}

Assistant:

bool borg_can_dig(bool check_fail, uint8_t feat)
{
    /* No digging when hungry */
    if (borg.trait[BI_ISHUNGRY])
        return false;

    /* some features can't be dug out */
    if (feat == FEAT_PERM || feat == FEAT_LAVA || feat < FEAT_SECRET)
        return false;

    int dig_check = feat == FEAT_GRANITE ? BORG_DIG_HARD : BORG_DIG;

    /* try digging even if it is hard when out of moves */
    if (borg.times_twitch > 21)
        dig_check -= 20;

    if ((weapon_swap && borg.trait[BI_DIG] >= dig_check
            && borg_items[weapon_swap - 1].tval == TV_DIGGING)
        || (borg.trait[BI_DIG] >= dig_check + 20))
        return true;

    if (feat == FEAT_RUBBLE && !borg.trait[BI_ISWEAK])
        return true;

    if (check_fail) {
        if (borg_spell_okay_fail(TURN_STONE_TO_MUD, 40)
            || borg_spell_okay_fail(SHATTER_STONE, 40)
            || borg_equips_item(act_stone_to_mud, true)
            || borg_equips_ring(sv_ring_digging))
            return true;
    } else {
        if (borg_spell_okay(TURN_STONE_TO_MUD) 
            || borg_spell_okay(SHATTER_STONE)
            || borg_equips_item(act_stone_to_mud, false)
            || borg_equips_ring(sv_ring_digging))
            return true;
    }

    return false;
}